

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fisheye.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  value_type *ppcVar1;
  char *__s2;
  int iVar2;
  GLFWwindow *handle;
  long lVar3;
  EVP_PKEY_CTX *ctx;
  char **__x;
  int iVar4;
  
  iVar4 = 1;
  do {
    if (argc <= iVar4) {
      glfwInit();
      glfwWindowHint(0x22002,4);
      glfwWindowHint(0x22003,5);
      glfwWindowHint(0x22008,0x32001);
      glfwWindowHint(0x22007,1);
      fwrite("Loading {Window-Main}\n",0x16,1,_stdout);
      fflush(_stdout);
      handle = glfwCreateWindow(0x690,0x41a,"Hello MERL",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
      if (handle == (GLFWwindow *)0x0) {
        fwrite("=> Failure <=\n",0xe,1,_stdout);
        fflush(_stdout);
        glfwTerminate();
      }
      else {
        glfwMakeContextCurrent(handle);
        glfwSetKeyCallback(handle,keyboardCallback);
        glfwSetCursorPosCallback(handle,mouseMotionCallback);
        glfwSetMouseButtonCallback(handle,mouseButtonCallback);
        glfwSetScrollCallback(handle,mouseScrollCallback);
        fwrite("Loading {OpenGL}\n",0x11,1,_stdout);
        fflush(_stdout);
        iVar4 = gladLoadGLLoader(glfwGetProcAddress);
        if (iVar4 != 0) {
          fwrite("-- Begin -- Demo\n",0x11,1,_stdout);
          fflush(_stdout);
          ImGui::CreateContext((ImFontAtlas *)0x0);
          ImGui_ImplGlfwGL3_Init(handle,false,(char *)0x0);
          ctx = (EVP_PKEY_CTX *)0x0;
          ImGui::StyleColorsDark((ImGuiStyle *)0x0);
          init(ctx);
          while (iVar4 = glfwWindowShouldClose(handle), iVar4 == 0) {
            glfwPollEvents();
            (*glad_glClearColor)(0.8,0.8,0.8,1.0);
            (*glad_glClear)(0x4000);
            render();
            glfwSwapBuffers(handle);
          }
          release();
          ImGui_ImplGlfwGL3_Shutdown();
          ImGui::DestroyContext((ImGuiContext *)0x0);
          glfwTerminate();
          fwrite("-- End -- Demo\n",0xf,1,_stdout);
          fflush(_stdout);
          return 0;
        }
        fwrite("gladLoadGLLoader failed\n",0x18,1,_stdout);
        fflush(_stdout);
      }
      return -1;
    }
    lVar3 = (long)iVar4;
    __s2 = argv[lVar3];
    iVar2 = strcmp("--envmap",__s2);
    if (iVar2 == 0) {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::resize(&g_ibl.files,0);
      __x = argv + lVar3 + 1;
      lVar3 = lVar3 + 2;
      do {
        iVar4 = iVar4 + 1;
        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back(&g_ibl.files,__x);
        if (argc <= lVar3) break;
        ppcVar1 = __x + 1;
        __x = __x + 1;
        lVar3 = lVar3 + 1;
      } while (**ppcVar1 != '-');
      fprintf(_stdout,"Note: number of Envmaps set to %i\n",
              (ulong)((long)g_ibl.files.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)g_ibl.files.
                           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 3);
LAB_00137ec4:
      fflush(_stdout);
    }
    else {
      iVar2 = strcmp("--shader-dir",__s2);
      if (iVar2 == 0) {
        iVar4 = iVar4 + 1;
        g_app.dir.shader = argv[lVar3 + 1];
        fprintf(_stdout,"Note: shader dir set to %s\n");
        goto LAB_00137ec4;
      }
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

int main(int argc, const char **argv)
{
    for (int i = 1; i < argc; ++i) {
        if (!strcmp("--envmap", argv[i])) {
            g_ibl.files.resize(0);
            do {
                g_ibl.files.push_back(argv[++i]);
            } while ((i+1 < argc) && strncmp("-", argv[i+1], 1));
            LOG("Note: number of Envmaps set to %i\n", (int)g_ibl.files.size());
        } else if (!strcmp("--shader-dir", argv[i])) {
            g_app.dir.shader = argv[++i];
            LOG("Note: shader dir set to %s\n", g_app.dir.shader);
        }
    }

    glfwInit();
    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 5);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
    glfwWindowHint(GLFW_OPENGL_DEBUG_CONTEXT, GL_TRUE);

    // Create the Window
    LOG("Loading {Window-Main}\n");
    GLFWwindow* window = glfwCreateWindow(
                             VIEWER_DEFAULT_WIDTH,
                             VIEWER_DEFAULT_HEIGHT,
                             "Hello MERL", NULL, NULL
                             );
    if (window == NULL) {
        LOG("=> Failure <=\n");
        glfwTerminate();
        return -1;
    }
    glfwMakeContextCurrent(window);
    glfwSetKeyCallback(window, &keyboardCallback);
    glfwSetCursorPosCallback(window, &mouseMotionCallback);
    glfwSetMouseButtonCallback(window, &mouseButtonCallback);
    glfwSetScrollCallback(window, &mouseScrollCallback);

    // Load OpenGL functions
    LOG("Loading {OpenGL}\n");
    if (!gladLoadGLLoader((GLADloadproc)glfwGetProcAddress)) {
        LOG("gladLoadGLLoader failed\n");
        return -1;
    }

    LOG("-- Begin -- Demo\n");
    try {
        //log_debug_output();
        ImGui::CreateContext();
        ImGui_ImplGlfwGL3_Init(window, false);
        ImGui::StyleColorsDark();
        init();

        while (!glfwWindowShouldClose(window)) {
            glfwPollEvents();

            glClearColor(0.8, 0.8, 0.8, 1.0);
            glClear(GL_COLOR_BUFFER_BIT);

            render();

            glfwSwapBuffers(window);
        }

        release();
        ImGui_ImplGlfwGL3_Shutdown();
        ImGui::DestroyContext();
        glfwTerminate();
    } catch (std::exception& e) {
        LOG("%s", e.what());
        ImGui_ImplGlfwGL3_Shutdown();
        ImGui::DestroyContext();
        glfwTerminate();
        LOG("(!) Demo Killed (!)\n");

        return EXIT_FAILURE;
    } catch (...) {
        ImGui_ImplGlfwGL3_Shutdown();
        ImGui::DestroyContext();
        glfwTerminate();
        LOG("(!) Demo Killed (!)\n");

        return EXIT_FAILURE;
    }
    LOG("-- End -- Demo\n");


    return 0;
}